

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

SubDFriendlyKnotType
ON_SubD::NurbsKnotType(int order,int cv_count,double *knots,ON_SimpleArray<double> *triple_knots)

{
  uint uVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  char cVar5;
  SubDFriendlyKnotType SVar6;
  SubDFriendlyKnotType SVar7;
  int iVar8;
  byte bVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if ((triple_knots != (ON_SimpleArray<double> *)0x0) && (-1 < triple_knots->m_capacity)) {
    triple_knots->m_count = 0;
  }
  if ((order == 4) && (SVar7 = cv_count < 4, knots != (double *)0x0 && !(bool)SVar7)) {
    dVar13 = knots[3] - knots[2];
    bVar10 = true;
    if (0.0 < dVar13) {
      bVar3 = -(*knots == knots[1] && knots[2] == knots[1]);
      uVar1 = cv_count - 1;
      dVar12 = knots[(uint)cv_count];
      if ((knots[uVar1] != dVar12) || (NAN(knots[uVar1]) || NAN(dVar12))) {
        bVar9 = 0;
      }
      else {
        bVar9 = -(dVar12 == knots[(ulong)(uint)cv_count + 1]) & 1;
      }
      if ((~bVar3 & 1) == 0 && triple_knots != (ON_SimpleArray<double> *)0x0) {
        ON_SimpleArray<double>::Append(triple_knots,knots + 2);
      }
      bVar10 = true;
      dVar12 = dVar13 * 1.490116119385e-08;
      SVar7 = bVar3 & bVar9;
      bVar4 = false;
      if (((((bool)SVar7 == false) && (ABS((knots[1] - *knots) - dVar13) <= dVar12)) &&
          (ABS((knots[2] - knots[1]) - dVar13) <= dVar12)) &&
         (ABS((knots[(uint)cv_count] - knots[uVar1]) - dVar13) <= dVar12)) {
        bVar4 = ABS((knots[(ulong)(uint)cv_count + 1] - knots[(uint)cv_count]) - dVar13) <= dVar12;
      }
      if (bVar4 != (bool)SVar7) {
        SVar6 = ClampedUniform;
        bVar10 = 4 < cv_count;
        if (4 < cv_count) {
          iVar8 = 3;
          cVar5 = '\0';
          do {
            dVar2 = knots[iVar8];
            dVar11 = knots[(long)iVar8 + 1] - dVar2;
            if ((dVar11 != 0.0) || (NAN(dVar11))) {
              bVar4 = true;
              if (dVar12 < ABS(dVar11 - dVar13)) goto LAB_0054a393;
            }
            else if ((((bool)SVar7 == false) || (knots[(long)iVar8 + 2] != dVar2)) ||
                    (NAN(knots[(long)iVar8 + 2]) || NAN(dVar2))) {
LAB_0054a393:
              bVar4 = false;
            }
            else {
              if (triple_knots != (ON_SimpleArray<double> *)0x0) {
                ON_SimpleArray<double>::Append(triple_knots,knots + (long)iVar8 + 1);
              }
              bVar4 = true;
              cVar5 = '\x01';
              iVar8 = iVar8 + 1;
            }
            if (!bVar4) break;
            iVar8 = iVar8 + 1;
            bVar10 = iVar8 < (int)uVar1;
          } while (iVar8 < (int)uVar1);
          SVar6 = cVar5 * '\x02' + ClampedUniform;
        }
        if (bVar10) {
          SVar7 = Unfriendly;
        }
        else {
          if (bVar9 == 1 && triple_knots != (ON_SimpleArray<double> *)0x0) {
            ON_SimpleArray<double>::Append(triple_knots,knots + uVar1);
          }
          bVar10 = (bool)SVar7 != false;
          SVar7 = UnclampedUniform;
          if (bVar10) {
            SVar7 = SVar6;
          }
        }
        bVar10 = false;
      }
    }
    if (!bVar10) {
      return SVar7;
    }
  }
  return Unfriendly;
}

Assistant:

ON_SubD::SubDFriendlyKnotType ON_SubD::NurbsKnotType(
    int order,
    int cv_count,
    const double* knots,
    ON_SimpleArray<double>* triple_knots
  )
{
  if (nullptr != triple_knots)
    triple_knots->SetCount(0);
  for (;;)
  {
    if (4 != order || cv_count < order || nullptr == knots)
      break;

    const double delta = knots[3] - knots[2];
    if (false == (delta > 0.0))
      break;

    const double deltatol = ON_SQRT_EPSILON * delta;

    const bool bClamped0 = knots[0] == knots[1] && knots[1] == knots[2];
    const bool bClamped1 = knots[cv_count - 1] == knots[cv_count] && knots[cv_count] == knots[cv_count + 1];
    if (bClamped0 && nullptr != triple_knots)
      triple_knots->Append(knots[2]);

    const bool bClamped = bClamped0 && bClamped1;
    const bool bUnclamped =
      (false == bClamped)
      && fabs(knots[1] - knots[0] - delta) <= deltatol
      && fabs(knots[2] - knots[1] - delta) <= deltatol
      && fabs(knots[cv_count] - knots[cv_count - 1] - delta) <= deltatol
      && fabs(knots[cv_count + 1] - knots[cv_count] - delta) <= deltatol
      ;
    if ( bClamped == bUnclamped)
      break;

    bool bPiecewiseUniform = false;
    for (int knot_dex = 3; knot_dex < cv_count - 1; ++knot_dex)
    {
      const double d = knots[knot_dex + 1] - knots[knot_dex];
      if (0.0 == d)
      {
        if (bClamped && knots[knot_dex + 2] == knots[knot_dex])
        {
          bPiecewiseUniform = true;
          ++knot_dex;
          if (bClamped1 && nullptr != triple_knots)
            triple_knots->Append(knots[knot_dex]);
          continue;
        }
      }
      else
      {
        if (fabs(d - delta) <= deltatol)
          continue;
      }
      return ON_SubD::SubDFriendlyKnotType::Unfriendly;
    }

    if (bClamped1 && nullptr != triple_knots)
      triple_knots->Append(knots[cv_count - 1]);

    return
      bClamped
      ? (bPiecewiseUniform ? ON_SubD::SubDFriendlyKnotType::ClampedPiecewiseUniform : ON_SubD::SubDFriendlyKnotType::ClampedUniform)
      : ON_SubD::SubDFriendlyKnotType::UnclampedUniform;
  }

  return ON_SubD::SubDFriendlyKnotType::Unfriendly;
}